

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void __thiscall
testing::TestInfo::TestInfo
          (TestInfo *this,string *a_test_suite_name,string *a_name,char *a_type_param,
          char *a_value_param,CodeLocation *a_code_location,TypeId fixture_class_id,
          TestFactoryBase *factory)

{
  CodeLocation *__s;
  char *__s_00;
  pointer local_d8;
  pointer local_b0;
  bool local_63;
  allocator<char> local_62;
  undefined1 local_61;
  pointer local_60;
  byte local_53;
  allocator<char> local_52;
  undefined1 local_51;
  pointer local_50;
  CodeLocation *local_38;
  CodeLocation *a_code_location_local;
  char *a_value_param_local;
  char *a_type_param_local;
  string *a_name_local;
  string *a_test_suite_name_local;
  TestInfo *this_local;
  
  local_38 = a_code_location;
  a_code_location_local = (CodeLocation *)a_value_param;
  a_value_param_local = a_type_param;
  a_type_param_local = (char *)a_name;
  a_name_local = a_test_suite_name;
  a_test_suite_name_local = &this->test_suite_name_;
  std::__cxx11::string::string((string *)this,(string *)a_test_suite_name);
  std::__cxx11::string::string((string *)&this->name_,(string *)a_name);
  local_51 = 0;
  local_53 = 0;
  if (a_value_param_local == (char *)0x0) {
    local_b0 = (pointer)0x0;
  }
  else {
    local_b0 = (pointer)operator_new(0x20);
    __s_00 = a_value_param_local;
    local_51 = 1;
    local_50 = local_b0;
    std::allocator<char>::allocator();
    local_53 = 1;
    std::__cxx11::string::string<std::allocator<char>>((string *)local_b0,__s_00,&local_52);
  }
  local_51 = 0;
  std::unique_ptr<std::__cxx11::string_const,std::default_delete<std::__cxx11::string_const>>::
  unique_ptr<std::default_delete<std::__cxx11::string_const>,void>
            ((unique_ptr<std::__cxx11::string_const,std::default_delete<std::__cxx11::string_const>>
              *)&this->type_param_,local_b0);
  if ((local_53 & 1) != 0) {
    std::allocator<char>::~allocator(&local_52);
  }
  local_61 = 0;
  local_63 = a_code_location_local == (CodeLocation *)0x0;
  if (local_63) {
    local_d8 = (pointer)0x0;
  }
  else {
    local_d8 = (pointer)operator_new(0x20);
    __s = a_code_location_local;
    local_61 = 1;
    local_60 = local_d8;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)local_d8,(char *)__s,&local_62);
  }
  local_61 = 0;
  local_63 = !local_63;
  std::unique_ptr<std::__cxx11::string_const,std::default_delete<std::__cxx11::string_const>>::
  unique_ptr<std::default_delete<std::__cxx11::string_const>,void>
            ((unique_ptr<std::__cxx11::string_const,std::default_delete<std::__cxx11::string_const>>
              *)&this->value_param_,local_d8);
  if (local_63) {
    std::allocator<char>::~allocator(&local_62);
  }
  internal::CodeLocation::CodeLocation(&this->location_,a_code_location);
  this->fixture_class_id_ = fixture_class_id;
  this->should_run_ = false;
  this->is_disabled_ = false;
  this->matches_filter_ = false;
  this->is_in_another_shard_ = false;
  this->factory_ = factory;
  TestResult::TestResult(&this->result_);
  return;
}

Assistant:

TestInfo::TestInfo(std::string a_test_suite_name, std::string a_name,
                   const char* a_type_param, const char* a_value_param,
                   internal::CodeLocation a_code_location,
                   internal::TypeId fixture_class_id,
                   internal::TestFactoryBase* factory)
    : test_suite_name_(std::move(a_test_suite_name)),
      name_(std::move(a_name)),
      type_param_(a_type_param ? new std::string(a_type_param) : nullptr),
      value_param_(a_value_param ? new std::string(a_value_param) : nullptr),
      location_(std::move(a_code_location)),
      fixture_class_id_(fixture_class_id),
      should_run_(false),
      is_disabled_(false),
      matches_filter_(false),
      is_in_another_shard_(false),
      factory_(factory),
      result_() {}